

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::emplaceRealloc<char_const(&)[2]>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,pointer pos,char (*args) [2])

{
  path *this_00;
  ulong uVar1;
  path *ppVar2;
  size_type sVar3;
  path *ppVar4;
  ulong uVar5;
  pointer __p;
  long lVar6;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar5 = this->len + 1;
  uVar1 = this->cap;
  if (uVar5 < uVar1 * 2) {
    uVar5 = uVar1 * 2;
  }
  if (0x333333333333333 - uVar1 < uVar1) {
    uVar5 = 0x333333333333333;
  }
  lVar6 = (long)pos - (long)this->data_;
  ppVar2 = (path *)operator_new(uVar5 * 0x28);
  this_00 = (path *)((long)ppVar2 + lVar6);
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (this_00,args,auto_format);
  __p = this->data_;
  sVar3 = this->len;
  if (__p + sVar3 == pos) {
    ppVar4 = ppVar2;
    if (sVar3 != 0) {
      do {
        args = (char (*) [2])__p;
        std::filesystem::__cxx11::path::path(ppVar4,__p);
        __p = __p + 1;
        ppVar4 = ppVar4 + 1;
      } while (__p != pos);
    }
  }
  else {
    ppVar4 = ppVar2;
    if (__p != pos) {
      do {
        args = (char (*) [2])__p;
        std::filesystem::__cxx11::path::path(ppVar4,__p);
        __p = __p + 1;
        ppVar4 = ppVar4 + 1;
      } while (__p != pos);
      __p = this->data_;
      sVar3 = this->len;
    }
    if (__p + sVar3 != pos) {
      ppVar4 = (path *)(lVar6 + (long)ppVar2);
      do {
        ppVar4 = ppVar4 + 1;
        args = (char (*) [2])pos;
        std::filesystem::__cxx11::path::path(ppVar4,pos);
        pos = pos + 1;
      } while (pos != __p + sVar3);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = uVar5;
  this->data_ = ppVar2;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}